

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_of_detail.c
# Opt level: O2

bool_t prf_level_of_detail_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint n_bytes;
  uint16_t uVar1;
  int16_t iVar2;
  int32_t iVar3;
  uint8_t *buffer;
  node_data_conflict5 *data;
  float64_t fVar4;
  
  uVar1 = bf_get_uint16_be(bfile);
  node->opcode = uVar1;
  if (uVar1 == prf_level_of_detail_info.opcode) {
    uVar1 = bf_get_uint16_be(bfile);
    node->length = uVar1;
    if (uVar1 < 0x48) {
      prf_error(9,"level of detail node too short (%d bytes)",(ulong)uVar1);
    }
    else {
      buffer = node->data;
      if (buffer != (uint8_t *)0x0) {
LAB_00107588:
        bf_read(bfile,buffer,8);
        iVar3 = bf_get_int32_be(bfile);
        *(int32_t *)(buffer + 8) = iVar3;
        fVar4 = bf_get_float64_be(bfile);
        *(float64_t *)(buffer + 0x10) = fVar4;
        fVar4 = bf_get_float64_be(bfile);
        *(float64_t *)(buffer + 0x18) = fVar4;
        iVar2 = bf_get_int16_be(bfile);
        *(int16_t *)(buffer + 0x20) = iVar2;
        iVar2 = bf_get_int16_be(bfile);
        *(int16_t *)(buffer + 0x22) = iVar2;
        iVar3 = bf_get_int32_be(bfile);
        *(int32_t *)(buffer + 0x24) = iVar3;
        fVar4 = bf_get_float64_be(bfile);
        *(float64_t *)(buffer + 0x28) = fVar4;
        fVar4 = bf_get_float64_be(bfile);
        *(float64_t *)(buffer + 0x30) = fVar4;
        fVar4 = bf_get_float64_be(bfile);
        *(float64_t *)(buffer + 0x38) = fVar4;
        fVar4 = bf_get_float64_be(bfile);
        *(float64_t *)(buffer + 0x40) = fVar4;
        if (node->length < 0x49) {
          return 1;
        }
        bf_read(bfile,node->data + 0x48,node->length - 0x48);
        return 1;
      }
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        buffer = (uint8_t *)malloc((ulong)uVar1);
      }
      else {
        buffer = (uint8_t *)pool_malloc(pool_id,(uint)uVar1);
      }
      node->data = buffer;
      if (buffer != (uint8_t *)0x0) goto LAB_00107588;
      prf_error(9,"memory allocation problem (returned NULL)");
    }
    n_bytes = 4;
  }
  else {
    prf_error(9,"tried level of detail node load method on node of type %d.",(ulong)uVar1);
    n_bytes = 2;
  }
  bf_rewind(bfile,n_bytes);
  return 0;
}

Assistant:

static bool_t
prf_level_of_detail_load_f(prf_node_t * node,
                           prf_state_t * state,
                           bfile_t * bfile)
{
  int pos;

  assert(node != NULL && state != NULL && bfile != NULL);
  
  node->opcode = bf_get_uint16_be(bfile);
  if (node->opcode != prf_level_of_detail_info.opcode) {
    prf_error(9,
              "tried level of detail node load method on node of type %d.",
              node->opcode);
    bf_rewind(bfile, 2);
    return FALSE;
  }

  node->length = bf_get_uint16_be(bfile);
  if (node->length < NODE_DATA_SIZE + 4) {
    prf_error(9, "level of detail node too short (%d bytes)", node->length);
    bf_rewind(bfile, 4);
    return FALSE;
  }

  if (node->length > 4 && node->data == NULL) {
    assert(state->model != NULL);
    if (state->model->mempool_id == 0) {
      node->data = (uint8_t *)malloc(node->length - 4 + NODE_DATA_PAD);
    }
    else {
      node->data = (uint8_t *)pool_malloc(state->model->mempool_id,
                                          node->length - 4 + NODE_DATA_PAD);
    }
    if (node->data == NULL) {
      prf_error(9, "memory allocation problem (returned NULL)");
      bf_rewind(bfile, 4);
      return FALSE;
    }
  }

  pos = 4;
  do {
    node_data * data;
    data = (node_data *) node->data;
    bf_read(bfile, data->id, 8); pos += 8;
    data->reserved = bf_get_int32_be(bfile); pos += 4;
    data->switch_in_distance = bf_get_float64_be(bfile); pos += 8;
    data->switch_out_distance = bf_get_float64_be(bfile); pos += 8;
    data->special_effect_id1 = bf_get_int16_be(bfile); pos += 2;
    data->special_effect_id2 = bf_get_int16_be(bfile); pos += 2;
    data->flags = bf_get_int32_be(bfile); pos += 4;
    data->center_x = bf_get_float64_be(bfile); pos += 8;
    data->center_y = bf_get_float64_be(bfile); pos += 8;
    data->center_z = bf_get_float64_be(bfile); pos += 8;
    data->transition_range = bf_get_float64_be(bfile); pos += 8;
  } while (FALSE);

  if (node->length > pos) {
    pos += bf_read(bfile, node->data + pos - 4 + NODE_DATA_PAD,
                   node->length - pos);
  }
  return TRUE;
}